

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_remove_handle(CURLM *multi_handle,CURL *curl_handle)

{
  connectdata **connp;
  uint uVar1;
  undefined8 *puVar2;
  CURLMcode CVar3;
  undefined8 *puVar4;
  SessionHandle *easy;
  curl_llist_element *e;
  long *plVar5;
  Curl_multi *multi;
  bool bVar6;
  
  CVar3 = CURLM_BAD_HANDLE;
  if ((((multi_handle != (CURLM *)0x0) && (*multi_handle == 0xbab1e)) &&
      (CVar3 = CURLM_BAD_EASY_HANDLE, curl_handle != (CURL *)0x0)) &&
     (*(int *)((long)curl_handle + 0x8b90) == -0x3f212453)) {
    if (*(long *)((long)curl_handle + 0x60) != 0) {
      uVar1 = *(uint *)((long)curl_handle + 0x18);
      plVar5 = *(long **)((long)curl_handle + 0x10);
      if (plVar5 == (long *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = (CURL *)*plVar5 == curl_handle;
      }
      if (uVar1 < 0x10) {
        *(int *)((long)multi_handle + 0x1c) = *(int *)((long)multi_handle + 0x1c) + -1;
      }
      if ((plVar5 != (long *)0x0) &&
         ((uVar1 & 0xfffffff8) == 8 &&
          1 < (ulong)(*(long *)(plVar5[0x69] + 0x18) + *(long *)(plVar5[0x68] + 0x18)))) {
        *(undefined1 *)(plVar5 + 0x51) = 1;
        *plVar5 = (long)curl_handle;
      }
      Curl_expire((SessionHandle *)curl_handle,0);
      if (*(curl_llist **)((long)curl_handle + 0x89f8) != (curl_llist *)0x0) {
        Curl_llist_destroy(*(curl_llist **)((long)curl_handle + 0x89f8),(void *)0x0);
        *(undefined8 *)((long)curl_handle + 0x89f8) = 0;
      }
      connp = (connectdata **)((long)curl_handle + 0x10);
      if (*(int *)((long)curl_handle + 0x58) == 2) {
        *(undefined8 *)((long)curl_handle + 0x50) = 0;
        *(undefined4 *)((long)curl_handle + 0x58) = 0;
      }
      if (*connp != (connectdata *)0x0) {
        if (bVar6) {
          Curl_done(connp,*(CURLcode *)((long)curl_handle + 0x1c),uVar1 < 0x10);
        }
        else {
          Curl_getoff_all_pipelines((SessionHandle *)curl_handle,*connp);
        }
      }
      Curl_wildcard_dtor((WildcardData *)((long)curl_handle + 0x8a70));
      *(undefined8 *)((long)curl_handle + 0x848) = 0;
      *(undefined4 *)((long)curl_handle + 0x18) = 0x10;
      singlesocket((Curl_multi *)multi_handle,(SessionHandle *)curl_handle);
      if (*(undefined8 **)((long)curl_handle + 0x10) != (undefined8 *)0x0) {
        **(undefined8 **)((long)curl_handle + 0x10) = 0;
        *connp = (connectdata *)0x0;
      }
      *(undefined8 *)((long)curl_handle + 0x60) = 0;
      for (e = (curl_llist_element *)**(undefined8 **)((long)multi_handle + 0x20);
          e != (curl_llist_element *)0x0; e = e->next) {
        if (*(CURL **)((long)e->ptr + 8) == curl_handle) {
          Curl_llist_remove(*(curl_llist **)((long)multi_handle + 0x20),e,(void *)0x0);
          break;
        }
      }
      puVar2 = *(undefined8 **)((long)curl_handle + 8);
      puVar4 = (undefined8 *)((long)multi_handle + 8);
      if (puVar2 != (undefined8 *)0x0) {
        puVar4 = puVar2;
      }
      *puVar4 = *curl_handle;
      plVar5 = (long *)(*curl_handle + 8);
      if (*curl_handle == 0) {
        plVar5 = (long *)((long)multi_handle + 0x10);
      }
      *plVar5 = (long)puVar2;
      *(int *)((long)multi_handle + 0x18) = *(int *)((long)multi_handle + 0x18) + -1;
      update_timer((Curl_multi *)multi_handle);
    }
    CVar3 = CURLM_OK;
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_remove_handle(CURLM *multi_handle,
                                   CURL *curl_handle)
{
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  struct SessionHandle *easy = curl_handle;
  struct SessionHandle *data = easy;

  /* First, make some basic checks that the CURLM handle is a good handle */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* Verify that we got a somewhat good easy handle too */
  if(!GOOD_EASY_HANDLE(curl_handle))
    return CURLM_BAD_EASY_HANDLE;

  /* Prevent users from trying to remove same easy handle more than once */
  if(!data->multi)
    return CURLM_OK; /* it is already removed so let's say it is fine! */

  if(easy) {
    bool premature = (data->mstate < CURLM_STATE_COMPLETED) ? TRUE : FALSE;
    bool easy_owns_conn = (data->easy_conn &&
                           (data->easy_conn->data == easy)) ?
                           TRUE : FALSE;

    /* If the 'state' is not INIT or COMPLETED, we might need to do something
       nice to put the easy_handle in a good known state when this returns. */
    if(premature)
      /* this handle is "alive" so we need to count down the total number of
         alive connections when this is removed */
      multi->num_alive--;

    if(data->easy_conn &&
       (data->easy_conn->send_pipe->size +
        data->easy_conn->recv_pipe->size > 1) &&
       data->mstate > CURLM_STATE_WAITDO &&
       data->mstate < CURLM_STATE_COMPLETED) {
      /* If the handle is in a pipeline and has started sending off its
         request but not received its response yet, we need to close
         connection. */
      connclose(data->easy_conn, "Removed with partial response");
      /* Set connection owner so that Curl_done() closes it.
         We can sefely do this here since connection is killed. */
      data->easy_conn->data = easy;
    }

    /* The timer must be shut down before data->multi is set to NULL,
       else the timenode will remain in the splay tree after
       curl_easy_cleanup is called. */
    Curl_expire(data, 0);

    /* destroy the timeout list that is held in the easy handle */
    if(data->state.timeoutlist) {
      Curl_llist_destroy(data->state.timeoutlist, NULL);
      data->state.timeoutlist = NULL;
    }

    if(data->dns.hostcachetype == HCACHE_MULTI) {
      /* stop using the multi handle's DNS cache */
      data->dns.hostcache = NULL;
      data->dns.hostcachetype = HCACHE_NONE;
    }

    if(data->easy_conn) {

      /* we must call Curl_done() here (if we still "own it") so that we don't
         leave a half-baked one around */
      if(easy_owns_conn) {

        /* Curl_done() clears the conn->data field to lose the association
           between the easy handle and the connection

           Note that this ignores the return code simply because there's
           nothing really useful to do with it anyway! */
        (void)Curl_done(&data->easy_conn, data->result, premature);
      }
      else
        /* Clear connection pipelines, if Curl_done above was not called */
        Curl_getoff_all_pipelines(data, data->easy_conn);
    }

    Curl_wildcard_dtor(&data->wildcard);

    /* as this was using a shared connection cache we clear the pointer
       to that since we're not part of that multi handle anymore */
    data->state.conn_cache = NULL;

    /* change state without using multistate(), only to make singlesocket() do
       what we want */
    data->mstate = CURLM_STATE_COMPLETED;
    singlesocket(multi, easy); /* to let the application know what sockets
                                  that vanish with this handle */

    /* Remove the association between the connection and the handle */
    if(data->easy_conn) {
      data->easy_conn->data = NULL;
      data->easy_conn = NULL;
    }

    data->multi = NULL; /* clear the association to this multi handle */

    {
      /* make sure there's no pending message in the queue sent from this easy
         handle */
      struct curl_llist_element *e;

      for(e = multi->msglist->head; e; e = e->next) {
        struct Curl_message *msg = e->ptr;

        if(msg->extmsg.easy_handle == easy) {
          Curl_llist_remove(multi->msglist, e, NULL);
          /* there can only be one from this specific handle */
          break;
        }
      }
    }

    /* make the previous node point to our next */
    if(data->prev)
      data->prev->next = data->next;
    else
      multi->easyp = data->next; /* point to first node */

    /* make our next point to our previous node */
    if(data->next)
      data->next->prev = data->prev;
    else
      multi->easylp = data->prev; /* point to last node */

    /* NOTE NOTE NOTE
       We do not touch the easy handle here! */

    multi->num_easy--; /* one less to care about now */

    update_timer(multi);
    return CURLM_OK;
  }
  else
    return CURLM_BAD_EASY_HANDLE; /* twasn't found */
}